

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  BVH *bvh;
  size_t sVar4;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  vfloat<4> vVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  GridSOA *pGVar24;
  bool bVar25;
  uint uVar26;
  undefined4 uVar27;
  int iVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  long lVar31;
  RTCIntersectArguments *pRVar32;
  uint uVar33;
  size_t sVar34;
  ulong uVar35;
  int iVar36;
  size_t sVar37;
  ulong uVar38;
  NodeRef *pNVar39;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar43;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar44;
  NodeRef root;
  ulong uVar45;
  long lVar46;
  float fVar47;
  float fVar71;
  float fVar72;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar73;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar74;
  float fVar92;
  float fVar93;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar94;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar95;
  float fVar96;
  float fVar102;
  float fVar104;
  undefined1 auVar97 [16];
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar108;
  float fVar109;
  float fVar119;
  float fVar121;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  float fVar126;
  float fVar135;
  float fVar138;
  undefined1 auVar128 [16];
  float fVar136;
  float fVar139;
  float fVar141;
  float fVar142;
  undefined1 auVar129 [16];
  float fVar127;
  float fVar137;
  float fVar140;
  float fVar143;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar144;
  float fVar150;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  float fVar164;
  float fVar165;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar166;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar170;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar177;
  float fVar178;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  uint uVar196;
  float fVar197;
  float fVar198;
  uint uVar199;
  float fVar200;
  float fVar201;
  uint uVar202;
  float fVar203;
  float fVar204;
  uint uVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar212;
  undefined1 auVar210 [16];
  float fVar213;
  undefined1 auVar211 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  uint local_1bc8;
  uint uStack_1bc4;
  uint uStack_1bc0;
  uint uStack_1bbc;
  float local_1ba8;
  float fStack_1ba4;
  float fStack_1ba0;
  float fStack_1b9c;
  float local_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float fStack_1b4c;
  RTCFilterFunctionNArguments args;
  OccludedFunc4 p_Stack_1af0;
  undefined1 local_1ae8 [16];
  GridSOA *local_1ad0;
  GridSOA *local_1ac8;
  GridSOA *local_1ac0;
  GridSOA *local_1ab8;
  GridSOA *local_1ab0;
  undefined1 local_1aa8 [8];
  float fStack_1aa0;
  float fStack_1a9c;
  undefined1 local_1a98 [8];
  float fStack_1a90;
  float fStack_1a8c;
  float local_1a88;
  float fStack_1a84;
  float fStack_1a80;
  float fStack_1a7c;
  vbool<4> terminated;
  GridSOA *local_1a58;
  GridSOA *local_1a50;
  Precalculations pre;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1a08;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined1 local_19c8 [8];
  float fStack_19c0;
  float fStack_19bc;
  float local_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  uint local_19a8;
  uint uStack_19a4;
  uint uStack_19a0;
  uint uStack_199c;
  uint local_1998;
  uint uStack_1994;
  uint uStack_1990;
  uint uStack_198c;
  uint local_1988;
  uint uStack_1984;
  uint uStack_1980;
  uint uStack_197c;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  Vec3vf<4> Ng;
  TravRayK<4,_true> tray;
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  float local_17c8;
  float fStack_17c4;
  float fStack_17c0;
  float fStack_17bc;
  undefined1 local_17b8 [16];
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  undefined1 local_1748 [16];
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  undefined8 local_1728;
  undefined8 uStack_1720;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar209 [16];
  
  uVar23 = mm_lookupmask_ps._8_8_;
  uVar22 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    pRVar32 = (RTCIntersectArguments *)ray;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar32 = context->args,
       (pRVar32->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar172._8_4_ = 0xffffffff;
    auVar172._0_8_ = 0xffffffffffffffff;
    auVar172._12_4_ = 0xffffffff;
    auVar152 = *(undefined1 (*) [16])(ray + 0x80);
    auVar180._0_12_ = ZEXT812(0);
    auVar180._12_4_ = 0;
    uVar196 = -(uint)(0.0 <= auVar152._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar199 = -(uint)(0.0 <= auVar152._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar202 = -(uint)(0.0 <= auVar152._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar205 = -(uint)(0.0 <= auVar152._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar75._4_4_ = uVar199;
    auVar75._0_4_ = uVar196;
    auVar75._8_4_ = uVar202;
    auVar75._12_4_ = uVar205;
    iVar36 = movmskps((int)pRVar32,auVar75);
    if (iVar36 != 0) {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar167 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar48._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < 1e-18);
      auVar48._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < 1e-18);
      auVar48._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < 1e-18);
      auVar48._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < 1e-18);
      auVar110 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar49._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < 1e-18);
      auVar49._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < 1e-18);
      auVar75 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar167,_DAT_01f76a70,auVar48)
      ;
      auVar49._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < 1e-18);
      auVar49._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar110,_DAT_01f76a70,auVar49)
      ;
      auVar110._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < 1e-18);
      auVar110._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < 1e-18);
      auVar110._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < 1e-18);
      auVar110._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar75,_DAT_01f76a70,auVar110)
      ;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar167._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar167._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar167._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar167._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar167);
      auVar50._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar50._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar50._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar50._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar50);
      auVar75 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar180);
      auVar152 = maxps(auVar152,auVar180);
      fVar184 = (float)DAT_01f45a30;
      fVar187 = DAT_01f45a30._4_4_;
      fVar190 = DAT_01f45a30._8_4_;
      fVar193 = DAT_01f45a30._12_4_;
      auVar51._4_4_ = uVar199;
      auVar51._0_4_ = uVar196;
      auVar51._8_4_ = uVar202;
      auVar51._12_4_ = uVar205;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar75,auVar51);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar152,auVar51);
      auVar152._4_4_ = uVar199;
      auVar152._0_4_ = uVar196;
      auVar152._8_4_ = uVar202;
      auVar152._12_4_ = uVar205;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar172 ^ auVar152);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar40 = 3;
        sVar34 = 0;
      }
      else {
        sVar34 = CONCAT71((int7)((ulong)context->args >> 8),
                          *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01;
        uVar40 = ((char)sVar34 == '\0') + 2;
      }
      pNVar39 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      puVar29 = mm_lookupmask_ps;
      paVar43 = &stack_near[2].field_0;
LAB_006d5668:
      do {
        do {
          root.ptr = pNVar39[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006d7033;
          pNVar39 = pNVar39 + -1;
          paVar44 = paVar43 + -1;
          local_1b58 = paVar44->v[0];
          fStack_1b54 = *(float *)((long)paVar43 + -0xc);
          fStack_1b50 = *(float *)((long)paVar43 + -8);
          fStack_1b4c = *(float *)((long)paVar43 + -4);
          vVar21.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar44->v;
          auVar52._4_4_ = -(uint)(fStack_1b54 < tray.tfar.field_0.v[1]);
          auVar52._0_4_ = -(uint)(local_1b58 < tray.tfar.field_0.v[0]);
          auVar52._8_4_ = -(uint)(fStack_1b50 < tray.tfar.field_0.v[2]);
          auVar52._12_4_ = -(uint)(fStack_1b4c < tray.tfar.field_0.v[3]);
          uVar26 = movmskps((int)puVar29,auVar52);
          puVar29 = (undefined1 *)(ulong)uVar26;
          paVar43 = paVar44;
        } while (uVar26 == 0);
        uVar42 = (ulong)(byte)uVar26;
        puVar30 = puVar29;
        if (uVar40 < (uint)POPCOUNT(uVar26 & 0xff)) {
LAB_006d56a9:
          pGVar24 = pre.super_Precalculations.grid;
          puVar29 = (undefined1 *)0x4;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006d7033;
              auVar57._4_4_ = -(uint)(fStack_1b54 < tray.tfar.field_0.v[1]);
              auVar57._0_4_ = -(uint)(local_1b58 < tray.tfar.field_0.v[0]);
              auVar57._8_4_ = -(uint)(fStack_1b50 < tray.tfar.field_0.v[2]);
              auVar57._12_4_ = -(uint)(fStack_1b4c < tray.tfar.field_0.v[3]);
              uVar26 = movmskps((int)puVar30,auVar57);
              puVar29 = (undefined1 *)(ulong)uVar26;
              if (uVar26 != 0) {
                if (((uint)root.ptr & 0xf) == 8) {
                  auVar149._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                  auVar149._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
                  auVar149._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
                  uVar38 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                  uVar35 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0xc);
                  uVar42 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                  iVar36 = *(int *)(pre.super_Precalculations.grid + 0x10);
                  lVar41 = uVar38 * 0xc + uVar42;
                  lVar1 = uVar35 * 4;
                  uVar45 = root.ptr >> 4;
                  local_1ac8 = pre.super_Precalculations.grid +
                               uVar45 * 4 + lVar41 + uVar35 * 4 + 0x2c;
                  lVar31 = uVar42 + uVar38 * 8;
                  local_1ab0 = pre.super_Precalculations.grid +
                               uVar45 * 4 + lVar31 + uVar35 * 4 + 0x30;
                  lVar46 = uVar42 + uVar38 * 4;
                  local_1ab8 = pre.super_Precalculations.grid +
                               uVar45 * 4 + lVar46 + uVar35 * 4 + 0x30;
                  local_1ac0 = pre.super_Precalculations.grid +
                               uVar45 * 4 + uVar42 + uVar35 * 4 + 0x30;
                  local_1ad0 = pre.super_Precalculations.grid + uVar45 * 4 + lVar41 + 0x30;
                  local_1a50 = pre.super_Precalculations.grid + uVar45 * 4 + lVar31 + 0x30;
                  local_1a58 = pre.super_Precalculations.grid + uVar45 * 4 + lVar46 + 0x30;
                  lVar31 = uVar42 + uVar45 * 4 + 0x2c;
                  sVar34 = 0;
                  while (valid_i = (vint<4> *)&args, sVar34 != (ulong)(iVar36 != 2) + 1) {
                    sVar34 = sVar34 + 1;
                    lVar46 = 0;
                    do {
                      if ((ulong)(uVar35 != 2) * 4 + 4 == lVar46) break;
                      fVar184 = *(float *)(pGVar24 + lVar46 + lVar31);
                      fVar187 = *(float *)(pGVar24 + lVar46 + lVar31 + 4);
                      fStack_1a8c = *(float *)(local_1a58 + lVar46 + -4);
                      fVar190 = *(float *)(local_1a58 + lVar46);
                      fStack_1a9c = *(float *)(local_1a50 + lVar46 + -4);
                      local_1a88 = *(float *)(local_1a50 + lVar46);
                      fVar193 = *(float *)(local_1ac0 + lVar46 + -4);
                      fVar178 = *(float *)(local_1ab8 + lVar46 + -4);
                      fVar213 = *(float *)(local_1ab0 + lVar46 + -4);
                      fVar126 = *(float *)ray;
                      fVar136 = *(float *)(ray + 4);
                      fVar139 = *(float *)(ray + 8);
                      fVar142 = *(float *)(ray + 0xc);
                      fVar47 = *(float *)(ray + 0x10);
                      fVar71 = *(float *)(ray + 0x14);
                      fVar72 = *(float *)(ray + 0x18);
                      fVar73 = *(float *)(ray + 0x1c);
                      fVar74 = *(float *)(ray + 0x20);
                      fVar92 = *(float *)(ray + 0x24);
                      fVar93 = *(float *)(ray + 0x28);
                      fVar94 = *(float *)(ray + 0x2c);
                      fVar214 = fVar184 - fVar126;
                      fVar216 = fVar184 - fVar136;
                      fVar218 = fVar184 - fVar139;
                      fVar184 = fVar184 - fVar142;
                      local_1a98._0_4_ = fStack_1a8c - fVar47;
                      local_1a98._4_4_ = fStack_1a8c - fVar71;
                      fStack_1a90 = fStack_1a8c - fVar72;
                      fStack_1a8c = fStack_1a8c - fVar73;
                      local_1aa8._0_4_ = fStack_1a9c - fVar74;
                      local_1aa8._4_4_ = fStack_1a9c - fVar92;
                      fStack_1aa0 = fStack_1a9c - fVar93;
                      fStack_1a9c = fStack_1a9c - fVar94;
                      fVar185 = fVar187 - fVar126;
                      fVar188 = fVar187 - fVar136;
                      fVar191 = fVar187 - fVar139;
                      fVar194 = fVar187 - fVar142;
                      fVar125 = fVar190 - fVar47;
                      fVar135 = fVar190 - fVar71;
                      fVar138 = fVar190 - fVar72;
                      fVar141 = fVar190 - fVar73;
                      fVar157 = local_1a88 - fVar74;
                      fVar164 = local_1a88 - fVar92;
                      fVar165 = local_1a88 - fVar93;
                      fVar166 = local_1a88 - fVar94;
                      fVar126 = fVar193 - fVar126;
                      fVar136 = fVar193 - fVar136;
                      fVar139 = fVar193 - fVar139;
                      fVar142 = fVar193 - fVar142;
                      fVar47 = fVar178 - fVar47;
                      fVar71 = fVar178 - fVar71;
                      fVar72 = fVar178 - fVar72;
                      fVar73 = fVar178 - fVar73;
                      fVar74 = fVar213 - fVar74;
                      fVar92 = fVar213 - fVar92;
                      fVar93 = fVar213 - fVar93;
                      fVar94 = fVar213 - fVar94;
                      fVar108 = fVar126 - fVar214;
                      fVar119 = fVar136 - fVar216;
                      fVar121 = fVar139 - fVar218;
                      fVar123 = fVar142 - fVar184;
                      fVar95 = fVar47 - (float)local_1a98._0_4_;
                      fVar102 = fVar71 - (float)local_1a98._4_4_;
                      fVar104 = fVar72 - fStack_1a90;
                      fVar106 = fVar73 - fStack_1a8c;
                      fVar197 = fVar74 - (float)local_1aa8._0_4_;
                      fVar200 = fVar92 - (float)local_1aa8._4_4_;
                      fVar203 = fVar93 - fStack_1aa0;
                      fVar206 = fVar94 - fStack_1a9c;
                      fVar151 = *(float *)(ray + 0x60);
                      fVar16 = *(float *)(ray + 100);
                      fVar17 = *(float *)(ray + 0x68);
                      fVar18 = *(float *)(ray + 0x6c);
                      fVar19 = *(float *)(ray + 0x50);
                      fVar20 = *(float *)(ray + 0x54);
                      fVar127 = *(float *)(ray + 0x58);
                      fVar137 = *(float *)(ray + 0x5c);
                      fVar140 = *(float *)(ray + 0x40);
                      fVar143 = *(float *)(ray + 0x44);
                      fVar144 = *(float *)(ray + 0x48);
                      fVar150 = *(float *)(ray + 0x4c);
                      fVar208 = (fVar95 * (fVar74 + (float)local_1aa8._0_4_) -
                                (fVar47 + (float)local_1a98._0_4_) * fVar197) * fVar140 +
                                ((fVar126 + fVar214) * fVar197 -
                                (fVar74 + (float)local_1aa8._0_4_) * fVar108) * fVar19 +
                                (fVar108 * (fVar47 + (float)local_1a98._0_4_) -
                                (fVar126 + fVar214) * fVar95) * fVar151;
                      fVar212 = (fVar102 * (fVar92 + (float)local_1aa8._4_4_) -
                                (fVar71 + (float)local_1a98._4_4_) * fVar200) * fVar143 +
                                ((fVar136 + fVar216) * fVar200 -
                                (fVar92 + (float)local_1aa8._4_4_) * fVar119) * fVar20 +
                                (fVar119 * (fVar71 + (float)local_1a98._4_4_) -
                                (fVar136 + fVar216) * fVar102) * fVar16;
                      auVar209._0_8_ = CONCAT44(fVar212,fVar208);
                      auVar209._8_4_ =
                           (fVar104 * (fVar93 + fStack_1aa0) - (fVar72 + fStack_1a90) * fVar203) *
                           fVar144 + ((fVar139 + fVar218) * fVar203 -
                                     (fVar93 + fStack_1aa0) * fVar121) * fVar127 +
                                     (fVar121 * (fVar72 + fStack_1a90) -
                                     (fVar139 + fVar218) * fVar104) * fVar17;
                      auVar209._12_4_ =
                           (fVar106 * (fVar94 + fStack_1a9c) - (fVar73 + fStack_1a8c) * fVar206) *
                           fVar150 + ((fVar142 + fVar184) * fVar206 -
                                     (fVar94 + fStack_1a9c) * fVar123) * fVar137 +
                                     (fVar123 * (fVar73 + fStack_1a8c) -
                                     (fVar142 + fVar184) * fVar106) * fVar18;
                      fVar109 = fVar214 - fVar185;
                      fVar120 = fVar216 - fVar188;
                      fVar122 = fVar218 - fVar191;
                      fVar124 = fVar184 - fVar194;
                      fVar170 = (float)local_1a98._0_4_ - fVar125;
                      fVar174 = (float)local_1a98._4_4_ - fVar135;
                      fVar175 = fStack_1a90 - fVar138;
                      fVar176 = fStack_1a8c - fVar141;
                      fVar96 = (float)local_1aa8._0_4_ - fVar157;
                      fVar103 = (float)local_1aa8._4_4_ - fVar164;
                      fVar105 = fStack_1aa0 - fVar165;
                      fVar107 = fStack_1a9c - fVar166;
                      fVar198 = (fVar170 * ((float)local_1aa8._0_4_ + fVar157) -
                                ((float)local_1a98._0_4_ + fVar125) * fVar96) * fVar140 +
                                ((fVar214 + fVar185) * fVar96 -
                                ((float)local_1aa8._0_4_ + fVar157) * fVar109) * fVar19 +
                                (fVar109 * ((float)local_1a98._0_4_ + fVar125) -
                                (fVar214 + fVar185) * fVar170) * fVar151;
                      fVar201 = (fVar174 * ((float)local_1aa8._4_4_ + fVar164) -
                                ((float)local_1a98._4_4_ + fVar135) * fVar103) * fVar143 +
                                ((fVar216 + fVar188) * fVar103 -
                                ((float)local_1aa8._4_4_ + fVar164) * fVar120) * fVar20 +
                                (fVar120 * ((float)local_1a98._4_4_ + fVar135) -
                                (fVar216 + fVar188) * fVar174) * fVar16;
                      fVar204 = (fVar175 * (fStack_1aa0 + fVar165) -
                                (fStack_1a90 + fVar138) * fVar105) * fVar144 +
                                ((fVar218 + fVar191) * fVar105 - (fStack_1aa0 + fVar165) * fVar122)
                                * fVar127 +
                                (fVar122 * (fStack_1a90 + fVar138) - (fVar218 + fVar191) * fVar175)
                                * fVar17;
                      fVar207 = (fVar176 * (fStack_1a9c + fVar166) -
                                (fStack_1a8c + fVar141) * fVar107) * fVar150 +
                                ((fVar184 + fVar194) * fVar107 - (fStack_1a9c + fVar166) * fVar124)
                                * fVar137 +
                                (fVar124 * (fStack_1a8c + fVar141) - (fVar184 + fVar194) * fVar176)
                                * fVar18;
                      fVar177 = fVar185 - fVar126;
                      fVar181 = fVar188 - fVar136;
                      fVar182 = fVar191 - fVar139;
                      fVar183 = fVar194 - fVar142;
                      fVar186 = fVar125 - fVar47;
                      fVar189 = fVar135 - fVar71;
                      fVar192 = fVar138 - fVar72;
                      fVar195 = fVar141 - fVar73;
                      fVar215 = fVar157 - fVar74;
                      fVar217 = fVar164 - fVar92;
                      fVar219 = fVar165 - fVar93;
                      fVar220 = fVar166 - fVar94;
                      fVar126 = (fVar186 * (fVar74 + fVar157) - (fVar47 + fVar125) * fVar215) *
                                fVar140 + ((fVar126 + fVar185) * fVar215 -
                                          (fVar74 + fVar157) * fVar177) * fVar19 +
                                          (fVar177 * (fVar47 + fVar125) -
                                          (fVar126 + fVar185) * fVar186) * fVar151;
                      fVar136 = (fVar189 * (fVar92 + fVar164) - (fVar71 + fVar135) * fVar217) *
                                fVar143 + ((fVar136 + fVar188) * fVar217 -
                                          (fVar92 + fVar164) * fVar181) * fVar20 +
                                          (fVar181 * (fVar71 + fVar135) -
                                          (fVar136 + fVar188) * fVar189) * fVar16;
                      fVar139 = (fVar192 * (fVar93 + fVar165) - (fVar72 + fVar138) * fVar219) *
                                fVar144 + ((fVar139 + fVar191) * fVar219 -
                                          (fVar93 + fVar165) * fVar182) * fVar127 +
                                          (fVar182 * (fVar72 + fVar138) -
                                          (fVar139 + fVar191) * fVar192) * fVar17;
                      fVar142 = (fVar195 * (fVar94 + fVar166) - (fVar73 + fVar141) * fVar220) *
                                fVar150 + ((fVar142 + fVar194) * fVar220 -
                                          (fVar94 + fVar166) * fVar183) * fVar137 +
                                          (fVar183 * (fVar73 + fVar141) -
                                          (fVar142 + fVar194) * fVar195) * fVar18;
                      auVar98._0_4_ = fVar208 + fVar198 + fVar126;
                      auVar98._4_4_ = fVar212 + fVar201 + fVar136;
                      auVar98._8_4_ = auVar209._8_4_ + fVar204 + fVar139;
                      auVar98._12_4_ = auVar209._12_4_ + fVar207 + fVar142;
                      auVar58._8_4_ = auVar209._8_4_;
                      auVar58._0_8_ = auVar209._0_8_;
                      auVar58._12_4_ = auVar209._12_4_;
                      auVar9._4_4_ = fVar201;
                      auVar9._0_4_ = fVar198;
                      auVar9._8_4_ = fVar204;
                      auVar9._12_4_ = fVar207;
                      auVar152 = minps(auVar58,auVar9);
                      auVar11._4_4_ = fVar136;
                      auVar11._0_4_ = fVar126;
                      auVar11._8_4_ = fVar139;
                      auVar11._12_4_ = fVar142;
                      auVar152 = minps(auVar152,auVar11);
                      auVar160._8_4_ = auVar209._8_4_;
                      auVar160._0_8_ = auVar209._0_8_;
                      auVar160._12_4_ = auVar209._12_4_;
                      auVar10._4_4_ = fVar201;
                      auVar10._0_4_ = fVar198;
                      auVar10._8_4_ = fVar204;
                      auVar10._12_4_ = fVar207;
                      auVar75 = maxps(auVar160,auVar10);
                      auVar12._4_4_ = fVar136;
                      auVar12._0_4_ = fVar126;
                      auVar12._8_4_ = fVar139;
                      auVar12._12_4_ = fVar142;
                      auVar75 = maxps(auVar75,auVar12);
                      local_1bc8 = auVar149._0_4_;
                      uStack_1bc4 = auVar149._4_4_;
                      uStack_1bc0 = auVar149._8_4_;
                      uStack_1bbc = auVar149._12_4_;
                      auVar161._0_8_ =
                           CONCAT44(-(uint)(auVar75._4_4_ <= ABS(auVar98._4_4_) * 1.1920929e-07 ||
                                           -(ABS(auVar98._4_4_) * 1.1920929e-07) <= auVar152._4_4_)
                                    & uStack_1bc4,
                                    -(uint)(auVar75._0_4_ <= ABS(auVar98._0_4_) * 1.1920929e-07 ||
                                           -(ABS(auVar98._0_4_) * 1.1920929e-07) <= auVar152._0_4_)
                                    & local_1bc8);
                      auVar161._8_4_ =
                           -(uint)(auVar75._8_4_ <= ABS(auVar98._8_4_) * 1.1920929e-07 ||
                                  -(ABS(auVar98._8_4_) * 1.1920929e-07) <= auVar152._8_4_) &
                           uStack_1bc0;
                      auVar161._12_4_ =
                           -(uint)(auVar75._12_4_ <= ABS(auVar98._12_4_) * 1.1920929e-07 ||
                                  -(ABS(auVar98._12_4_) * 1.1920929e-07) <= auVar152._12_4_) &
                           uStack_1bbc;
                      iVar28 = movmskps((int)local_1ab0,auVar161);
                      p_Stack_1af0 = auVar209._8_8_;
                      if (iVar28 == 0) {
                        auVar156._8_4_ = auVar161._8_4_;
                        auVar156._0_8_ = auVar161._0_8_;
                        auVar156._12_4_ = auVar161._12_4_;
                      }
                      else {
                        auVar129._0_4_ = fVar95 * fVar96 - fVar170 * fVar197;
                        auVar129._4_4_ = fVar102 * fVar103 - fVar174 * fVar200;
                        auVar129._8_4_ = fVar104 * fVar105 - fVar175 * fVar203;
                        auVar129._12_4_ = fVar106 * fVar107 - fVar176 * fVar206;
                        auVar171._0_4_ = fVar170 * fVar215 - fVar186 * fVar96;
                        auVar171._4_4_ = fVar174 * fVar217 - fVar189 * fVar103;
                        auVar171._8_4_ = fVar175 * fVar219 - fVar192 * fVar105;
                        auVar171._12_4_ = fVar176 * fVar220 - fVar195 * fVar107;
                        auVar59._4_4_ = -(uint)(ABS(fVar174 * fVar200) < ABS(fVar189 * fVar103));
                        auVar59._0_4_ = -(uint)(ABS(fVar170 * fVar197) < ABS(fVar186 * fVar96));
                        auVar59._8_4_ = -(uint)(ABS(fVar175 * fVar203) < ABS(fVar192 * fVar105));
                        auVar59._12_4_ = -(uint)(ABS(fVar176 * fVar206) < ABS(fVar195 * fVar107));
                        auVar172 = blendvps(auVar171,auVar129,auVar59);
                        auVar168._0_4_ = fVar197 * fVar109 - fVar108 * fVar96;
                        auVar168._4_4_ = fVar200 * fVar120 - fVar119 * fVar103;
                        auVar168._8_4_ = fVar203 * fVar122 - fVar121 * fVar105;
                        auVar168._12_4_ = fVar206 * fVar124 - fVar123 * fVar107;
                        auVar179._0_4_ = fVar177 * fVar96 - fVar109 * fVar215;
                        auVar179._4_4_ = fVar181 * fVar103 - fVar120 * fVar217;
                        auVar179._8_4_ = fVar182 * fVar105 - fVar122 * fVar219;
                        auVar179._12_4_ = fVar183 * fVar107 - fVar124 * fVar220;
                        auVar60._4_4_ = -(uint)(ABS(fVar119 * fVar103) < ABS(fVar120 * fVar217));
                        auVar60._0_4_ = -(uint)(ABS(fVar108 * fVar96) < ABS(fVar109 * fVar215));
                        auVar60._8_4_ = -(uint)(ABS(fVar121 * fVar105) < ABS(fVar122 * fVar219));
                        auVar60._12_4_ = -(uint)(ABS(fVar123 * fVar107) < ABS(fVar124 * fVar220));
                        auVar180 = blendvps(auVar179,auVar168,auVar60);
                        auVar210._0_4_ = fVar108 * fVar170 - fVar109 * fVar95;
                        auVar210._4_4_ = fVar119 * fVar174 - fVar120 * fVar102;
                        auVar210._8_4_ = fVar121 * fVar175 - fVar122 * fVar104;
                        auVar210._12_4_ = fVar123 * fVar176 - fVar124 * fVar106;
                        auVar112._0_4_ = fVar109 * fVar186 - fVar177 * fVar170;
                        auVar112._4_4_ = fVar120 * fVar189 - fVar181 * fVar174;
                        auVar112._8_4_ = fVar122 * fVar192 - fVar182 * fVar175;
                        auVar112._12_4_ = fVar124 * fVar195 - fVar183 * fVar176;
                        auVar61._4_4_ = -(uint)(ABS(fVar120 * fVar102) < ABS(fVar181 * fVar174));
                        auVar61._0_4_ = -(uint)(ABS(fVar109 * fVar95) < ABS(fVar177 * fVar170));
                        auVar61._8_4_ = -(uint)(ABS(fVar122 * fVar104) < ABS(fVar182 * fVar175));
                        auVar61._12_4_ = -(uint)(ABS(fVar124 * fVar106) < ABS(fVar183 * fVar176));
                        auVar75 = blendvps(auVar112,auVar210,auVar61);
                        fVar126 = fVar140 * auVar172._0_4_ +
                                  fVar19 * auVar180._0_4_ + fVar151 * auVar75._0_4_;
                        fVar136 = fVar143 * auVar172._4_4_ +
                                  fVar20 * auVar180._4_4_ + fVar16 * auVar75._4_4_;
                        fVar139 = fVar144 * auVar172._8_4_ +
                                  fVar127 * auVar180._8_4_ + fVar17 * auVar75._8_4_;
                        fVar142 = fVar150 * auVar172._12_4_ +
                                  fVar137 * auVar180._12_4_ + fVar18 * auVar75._12_4_;
                        auVar154._0_4_ = fVar126 + fVar126;
                        auVar154._4_4_ = fVar136 + fVar136;
                        auVar154._8_4_ = fVar139 + fVar139;
                        auVar154._12_4_ = fVar142 + fVar142;
                        auVar80._0_4_ = (float)local_1aa8._0_4_ * auVar75._0_4_;
                        auVar80._4_4_ = (float)local_1aa8._4_4_ * auVar75._4_4_;
                        auVar80._8_4_ = fStack_1aa0 * auVar75._8_4_;
                        auVar80._12_4_ = fStack_1a9c * auVar75._12_4_;
                        fVar142 = fVar214 * auVar172._0_4_ +
                                  (float)local_1a98._0_4_ * auVar180._0_4_ + auVar80._0_4_;
                        fVar47 = fVar216 * auVar172._4_4_ +
                                 (float)local_1a98._4_4_ * auVar180._4_4_ + auVar80._4_4_;
                        fVar71 = fVar218 * auVar172._8_4_ +
                                 fStack_1a90 * auVar180._8_4_ + auVar80._8_4_;
                        fVar72 = fVar184 * auVar172._12_4_ +
                                 fStack_1a8c * auVar180._12_4_ + auVar80._12_4_;
                        auVar152 = rcpps(auVar80,auVar154);
                        fVar184 = auVar152._0_4_;
                        fVar126 = auVar152._4_4_;
                        fVar136 = auVar152._8_4_;
                        fVar139 = auVar152._12_4_;
                        fVar184 = ((1.0 - auVar154._0_4_ * fVar184) * fVar184 + fVar184) *
                                  (fVar142 + fVar142);
                        fVar126 = ((1.0 - auVar154._4_4_ * fVar126) * fVar126 + fVar126) *
                                  (fVar47 + fVar47);
                        fVar136 = ((1.0 - auVar154._8_4_ * fVar136) * fVar136 + fVar136) *
                                  (fVar71 + fVar71);
                        fVar139 = ((1.0 - auVar154._12_4_ * fVar139) * fVar139 + fVar139) *
                                  (fVar72 + fVar72);
                        auVar155._0_4_ =
                             (int)((uint)(auVar154._0_4_ != 0.0 &&
                                         (fVar184 <= *(float *)(ray + 0x80) &&
                                         *(float *)(ray + 0x30) <= fVar184)) * -0x80000000) >> 0x1f;
                        auVar155._4_4_ =
                             (int)((uint)(auVar154._4_4_ != 0.0 &&
                                         (fVar126 <= *(float *)(ray + 0x84) &&
                                         *(float *)(ray + 0x34) <= fVar126)) * -0x80000000) >> 0x1f;
                        auVar155._8_4_ =
                             (int)((uint)(auVar154._8_4_ != 0.0 &&
                                         (fVar136 <= *(float *)(ray + 0x88) &&
                                         *(float *)(ray + 0x38) <= fVar136)) * -0x80000000) >> 0x1f;
                        auVar155._12_4_ =
                             (int)((uint)(auVar154._12_4_ != 0.0 &&
                                         (fVar139 <= *(float *)(ray + 0x8c) &&
                                         *(float *)(ray + 0x3c) <= fVar139)) * -0x80000000) >> 0x1f;
                        auVar156 = auVar155 & auVar161;
                        iVar28 = movmskps(iVar28,auVar156);
                        if (iVar28 != 0) {
                          uStack_1720 = p_Stack_1af0;
                          local_1788 = auVar75;
                          local_1778 = auVar180;
                          local_1768 = auVar172;
                          local_1758 = fVar184;
                          fStack_1754 = fVar126;
                          fStack_1750 = fVar136;
                          fStack_174c = fVar139;
                          local_1748 = auVar98;
                          local_1738 = fVar198;
                          fStack_1734 = fVar201;
                          fStack_1730 = fVar204;
                          fStack_172c = fVar207;
                          local_1728 = auVar209._0_8_;
                        }
                      }
                      auVar163._4_4_ = fVar178;
                      auVar163._0_4_ = fVar178;
                      auVar163._8_4_ = fVar178;
                      auVar163._12_4_ = fVar178;
                      fVar184 = *(float *)(local_1ac0 + lVar46);
                      fVar126 = *(float *)(local_1ab8 + lVar46);
                      fVar136 = *(float *)(local_1ab0 + lVar46);
                      uVar26 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                      pRVar5 = (context->scene->geometries).items;
                      pGVar6 = pRVar5[uVar26].ptr;
                      uVar33 = pGVar6->mask;
                      auVar113._0_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x90)) == 0);
                      auVar113._4_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x94)) == 0);
                      auVar113._8_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x98)) == 0);
                      auVar113._12_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x9c)) == 0);
                      auVar114 = ~auVar113 & auVar156;
                      iVar28 = movmskps((int)pRVar5,auVar114);
                      pRVar32 = (RTCIntersectArguments *)pre.super_Precalculations.grid;
                      fStack_1a84 = local_1a88;
                      fStack_1a80 = local_1a88;
                      fStack_1a7c = local_1a88;
                      if (iVar28 != 0) {
                        uVar27 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                        pRVar32 = context->args;
                        if ((pRVar32->filter != (RTCFilterFunctionN)0x0) ||
                           (auVar152 = ZEXT416((uint)fVar126),
                           pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          _local_1a98 = ZEXT416((uint)fVar136);
                          auVar152 = rcpps(ZEXT416(uVar33),local_1748);
                          fVar136 = auVar152._0_4_;
                          fVar139 = auVar152._4_4_;
                          fVar142 = auVar152._8_4_;
                          fVar47 = auVar152._12_4_;
                          fVar136 = (float)(-(uint)(1e-18 <= ABS(local_1748._0_4_)) &
                                           (uint)(((float)DAT_01f46a60 - local_1748._0_4_ * fVar136)
                                                  * fVar136 + fVar136));
                          fVar139 = (float)(-(uint)(1e-18 <= ABS(local_1748._4_4_)) &
                                           (uint)((DAT_01f46a60._4_4_ - local_1748._4_4_ * fVar139)
                                                  * fVar139 + fVar139));
                          fVar142 = (float)(-(uint)(1e-18 <= ABS(local_1748._8_4_)) &
                                           (uint)((DAT_01f46a60._8_4_ - local_1748._8_4_ * fVar142)
                                                  * fVar142 + fVar142));
                          fVar47 = (float)(-(uint)(1e-18 <= ABS(local_1748._12_4_)) &
                                          (uint)((DAT_01f46a60._12_4_ - local_1748._12_4_ * fVar47)
                                                 * fVar47 + fVar47));
                          auVar66._0_4_ = (float)local_1728 * fVar136;
                          auVar66._4_4_ = local_1728._4_4_ * fVar139;
                          auVar66._8_4_ = (float)uStack_1720 * fVar142;
                          auVar66._12_4_ = uStack_1720._4_4_ * fVar47;
                          auVar152 = minps(auVar66,_DAT_01f46a60);
                          auVar84._0_4_ = fVar136 * local_1738;
                          auVar84._4_4_ = fVar139 * fStack_1734;
                          auVar84._8_4_ = fVar142 * fStack_1730;
                          auVar84._12_4_ = fVar47 * fStack_172c;
                          auVar75 = minps(auVar84,_DAT_01f46a60);
                          uVar33 = *(uint *)(local_1ad0 + lVar46 + -4);
                          auVar100._4_4_ = uVar33;
                          auVar100._0_4_ = uVar33;
                          auVar100._8_4_ = uVar33;
                          auVar100._12_4_ = uVar33;
                          auVar172 = pblendw(auVar100,(undefined1  [16])0x0,0xaa);
                          uVar2 = *(uint *)(local_1ac8 + lVar46);
                          auVar133._4_4_ = uVar2;
                          auVar133._0_4_ = uVar2;
                          auVar133._8_4_ = uVar2;
                          auVar133._12_4_ = uVar2;
                          fVar136 = auVar152._0_4_;
                          fVar139 = auVar152._4_4_;
                          fVar142 = auVar152._8_4_;
                          fVar47 = auVar152._12_4_;
                          fVar71 = auVar75._0_4_;
                          fVar92 = ((float)DAT_01f46a60 - fVar136) - fVar71;
                          fVar72 = auVar75._4_4_;
                          fVar93 = (DAT_01f46a60._4_4_ - fVar139) - fVar72;
                          fVar73 = auVar75._8_4_;
                          fVar94 = (DAT_01f46a60._8_4_ - fVar142) - fVar73;
                          fVar74 = auVar75._12_4_;
                          fVar151 = (DAT_01f46a60._12_4_ - fVar47) - fVar74;
                          auVar75 = pblendw(auVar133,(undefined1  [16])0x0,0xaa);
                          uVar3 = *(uint *)(local_1ad0 + lVar46);
                          auVar85._4_4_ = uVar3;
                          auVar85._0_4_ = uVar3;
                          auVar85._8_4_ = uVar3;
                          auVar85._12_4_ = uVar3;
                          auVar152 = pblendw(auVar85,(undefined1  [16])0x0,0xaa);
                          local_19b8 = (float)auVar152._0_4_ * 0.00012207031 * fVar136 +
                                       (float)auVar75._0_4_ * 0.00012207031 * fVar71 +
                                       (float)auVar172._0_4_ * 0.00012207031 * fVar92;
                          fStack_19b4 = (float)auVar152._4_4_ * 0.00012207031 * fVar139 +
                                        (float)auVar75._4_4_ * 0.00012207031 * fVar72 +
                                        (float)auVar172._4_4_ * 0.00012207031 * fVar93;
                          fStack_19b0 = (float)auVar152._8_4_ * 0.00012207031 * fVar142 +
                                        (float)auVar75._8_4_ * 0.00012207031 * fVar73 +
                                        (float)auVar172._8_4_ * 0.00012207031 * fVar94;
                          fStack_19ac = (float)auVar152._12_4_ * 0.00012207031 * fVar47 +
                                        (float)auVar75._12_4_ * 0.00012207031 * fVar74 +
                                        (float)auVar172._12_4_ * 0.00012207031 * fVar151;
                          local_1a08._0_8_ = local_1768._0_8_;
                          local_1a08._8_8_ = local_1768._8_8_;
                          local_1a08._16_8_ = local_1778._0_8_;
                          local_1a08._24_8_ = local_1778._8_8_;
                          local_1a08._32_8_ = local_1788._0_8_;
                          local_1a08._40_8_ = local_1788._8_8_;
                          local_19d8 = CONCAT44(fStack_1754,local_1758);
                          uStack_19d0 = CONCAT44(fStack_174c,fStack_1750);
                          local_19c8._4_4_ =
                               (float)(uVar3 >> 0x10) * 0.00012207031 * fVar139 +
                               (float)(uVar2 >> 0x10) * 0.00012207031 * fVar72 +
                               fVar93 * (float)(uVar33 >> 0x10) * 0.00012207031;
                          local_19c8._0_4_ =
                               (float)(uVar3 >> 0x10) * 0.00012207031 * fVar136 +
                               (float)(uVar2 >> 0x10) * 0.00012207031 * fVar71 +
                               fVar92 * (float)(uVar33 >> 0x10) * 0.00012207031;
                          fStack_19c0 = (float)(uVar3 >> 0x10) * 0.00012207031 * fVar142 +
                                        (float)(uVar2 >> 0x10) * 0.00012207031 * fVar73 +
                                        fVar94 * (float)(uVar33 >> 0x10) * 0.00012207031;
                          fStack_19bc = (float)(uVar3 >> 0x10) * 0.00012207031 * fVar47 +
                                        (float)(uVar2 >> 0x10) * 0.00012207031 * fVar74 +
                                        fVar151 * (float)(uVar33 >> 0x10) * 0.00012207031;
                          args.valid = (int *)&Ng;
                          args.geometryUserPtr = &t;
                          args.context = (RTCRayQueryContext *)&v;
                          args.ray = (RTCRayN *)&u;
                          _local_1aa8 = ZEXT416((uint)fVar126);
                          std::
                          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                          ::
                          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                               *)&local_1a08.field_0);
                          local_1a08._0_8_ = Ng.field_0._0_8_;
                          local_1a08._8_8_ = Ng.field_0._8_8_;
                          local_1a08._16_8_ = Ng.field_0._16_8_;
                          local_1a08._24_8_ = Ng.field_0._24_8_;
                          local_1a08._32_8_ = Ng.field_0._32_8_;
                          local_1a08._40_8_ = Ng.field_0._40_8_;
                          local_19d8 = u.field_0._0_8_;
                          uStack_19d0 = u.field_0._8_8_;
                          _local_19c8 = v.field_0;
                          local_1998 = context->user->instID[0];
                          local_1988 = context->user->instPrimID[0];
                          auVar152 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar75 = blendvps(auVar152,(undefined1  [16])t.field_0,auVar114);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar75;
                          args.valid = (int *)local_1ae8;
                          args.geometryUserPtr = pGVar6->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_1a08;
                          args.N = 4;
                          pRVar32 = (RTCIntersectArguments *)pGVar6->occlusionFilterN;
                          args.ray = (RTCRayN *)ray;
                          local_1ae8 = auVar114;
                          local_19b8 = (float)uVar27;
                          fStack_19b4 = (float)uVar27;
                          fStack_19b0 = (float)uVar27;
                          fStack_19ac = (float)uVar27;
                          local_19a8 = uVar26;
                          uStack_19a4 = uVar26;
                          uStack_19a0 = uVar26;
                          uStack_199c = uVar26;
                          uStack_1994 = local_1998;
                          uStack_1990 = local_1998;
                          uStack_198c = local_1998;
                          uStack_1984 = local_1988;
                          uStack_1980 = local_1988;
                          uStack_197c = local_1988;
                          if (pRVar32 != (RTCIntersectArguments *)0x0) {
                            pRVar32 = (RTCIntersectArguments *)(*(code *)pRVar32)(&args);
                          }
                          if (local_1ae8 == (undefined1  [16])0x0) {
                            auVar88._8_4_ = 0xffffffff;
                            auVar88._0_8_ = 0xffffffffffffffff;
                            auVar88._12_4_ = 0xffffffff;
                            auVar88 = auVar88 ^ _DAT_01f46b70;
                          }
                          else {
                            p_Var7 = context->args->filter;
                            if (p_Var7 == (RTCFilterFunctionN)0x0) {
                            }
                            else if (((context->args->flags &
                                      RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                      RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var7)(&args);
                            }
                            auVar68._0_4_ = -(uint)(local_1ae8._0_4_ == 0);
                            auVar68._4_4_ = -(uint)(local_1ae8._4_4_ == 0);
                            auVar68._8_4_ = -(uint)(local_1ae8._8_4_ == 0);
                            auVar68._12_4_ = -(uint)(local_1ae8._12_4_ == 0);
                            auVar88 = auVar68 ^ _DAT_01f46b70;
                            auVar75 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80)
                                               ,auVar68);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar75;
                            pRVar32 = (RTCIntersectArguments *)args.ray;
                          }
                          auVar89._0_4_ = auVar88._0_4_ << 0x1f;
                          auVar89._4_4_ = auVar88._4_4_ << 0x1f;
                          auVar89._8_4_ = auVar88._8_4_ << 0x1f;
                          auVar89._12_4_ = auVar88._12_4_ << 0x1f;
                          auVar114._0_4_ = auVar89._0_4_ >> 0x1f;
                          auVar114._4_4_ = auVar89._4_4_ >> 0x1f;
                          auVar114._8_4_ = auVar89._8_4_ >> 0x1f;
                          auVar114._12_4_ = auVar89._12_4_ >> 0x1f;
                          auVar152 = blendvps(auVar152,*(undefined1 (*) [16])(ray + 0x80),auVar89);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar152;
                          auVar152 = _local_1aa8;
                          fVar136 = (float)local_1a98._0_4_;
                        }
                        fVar126 = auVar152._0_4_;
                        auVar149._4_4_ = ~auVar114._4_4_ & uStack_1bc4;
                        auVar149._0_4_ = ~auVar114._0_4_ & local_1bc8;
                        auVar149._8_4_ = ~auVar114._8_4_ & uStack_1bc0;
                        auVar149._12_4_ = ~auVar114._12_4_ & uStack_1bbc;
                      }
                      iVar28 = movmskps((int)pRVar32,auVar149);
                      if (iVar28 == 0) {
                        fVar184 = INFINITY;
                        fVar187 = INFINITY;
                        fVar190 = INFINITY;
                        fVar193 = INFINITY;
                        break;
                      }
                      fVar178 = *(float *)ray;
                      fVar139 = *(float *)(ray + 4);
                      fVar142 = *(float *)(ray + 8);
                      fVar47 = *(float *)(ray + 0xc);
                      fVar71 = *(float *)(ray + 0x10);
                      fVar72 = *(float *)(ray + 0x14);
                      fVar73 = *(float *)(ray + 0x18);
                      fVar74 = *(float *)(ray + 0x1c);
                      fVar92 = *(float *)(ray + 0x20);
                      fVar93 = *(float *)(ray + 0x24);
                      fVar94 = *(float *)(ray + 0x28);
                      fVar151 = *(float *)(ray + 0x2c);
                      fVar16 = *(float *)(ray + 0x40);
                      fVar17 = *(float *)(ray + 0x44);
                      fVar18 = *(float *)(ray + 0x48);
                      fVar19 = *(float *)(ray + 0x4c);
                      fVar174 = fVar193 - fVar178;
                      fVar176 = fVar193 - fVar139;
                      fVar181 = fVar193 - fVar142;
                      fVar193 = fVar193 - fVar47;
                      fVar135 = auVar163._0_4_ - fVar71;
                      fVar141 = auVar163._4_4_ - fVar72;
                      fVar164 = auVar163._8_4_ - fVar73;
                      fVar166 = auVar163._12_4_ - fVar74;
                      fVar189 = fVar213 - fVar92;
                      fVar192 = fVar213 - fVar93;
                      fVar195 = fVar213 - fVar94;
                      fVar213 = fVar213 - fVar151;
                      fVar185 = fVar187 - fVar178;
                      fVar186 = fVar187 - fVar139;
                      fVar188 = fVar187 - fVar142;
                      fVar187 = fVar187 - fVar47;
                      fVar144 = fVar190 - fVar71;
                      fVar150 = fVar190 - fVar72;
                      fVar95 = fVar190 - fVar73;
                      fVar190 = fVar190 - fVar74;
                      fVar96 = local_1a88 - fVar92;
                      fVar105 = fStack_1a84 - fVar93;
                      fVar109 = fStack_1a80 - fVar94;
                      fVar122 = fStack_1a7c - fVar151;
                      fVar178 = fVar184 - fVar178;
                      fVar139 = fVar184 - fVar139;
                      fVar142 = fVar184 - fVar142;
                      fVar184 = fVar184 - fVar47;
                      fVar71 = fVar126 - fVar71;
                      fVar72 = fVar126 - fVar72;
                      fVar73 = fVar126 - fVar73;
                      fVar126 = fVar126 - fVar74;
                      fVar92 = fVar136 - fVar92;
                      fVar93 = fVar136 - fVar93;
                      fVar94 = fVar136 - fVar94;
                      fVar136 = fVar136 - fVar151;
                      fVar102 = fVar178 - fVar174;
                      fVar106 = fVar139 - fVar176;
                      fVar119 = fVar142 - fVar181;
                      fVar123 = fVar184 - fVar193;
                      local_1aa8._0_4_ = fVar71 - fVar135;
                      local_1aa8._4_4_ = fVar72 - fVar141;
                      fStack_1aa0 = fVar73 - fVar164;
                      fStack_1a9c = fVar126 - fVar166;
                      local_1a98._0_4_ = fVar92 - fVar189;
                      local_1a98._4_4_ = fVar93 - fVar192;
                      fStack_1a90 = fVar94 - fVar195;
                      fStack_1a8c = fVar136 - fVar213;
                      fVar47 = *(float *)(ray + 0x60);
                      fVar74 = *(float *)(ray + 100);
                      fVar151 = *(float *)(ray + 0x68);
                      fVar20 = *(float *)(ray + 0x6c);
                      fVar138 = fVar174 - fVar185;
                      fVar157 = fVar176 - fVar186;
                      fVar165 = fVar181 - fVar188;
                      fVar170 = fVar193 - fVar187;
                      local_1ba8 = (float)*(undefined8 *)(ray + 0x50);
                      fStack_1ba4 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                      fStack_1ba0 = (float)*(undefined8 *)(ray + 0x58);
                      fStack_1b9c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                      fVar127 = fVar135 - fVar144;
                      fVar137 = fVar141 - fVar150;
                      fVar140 = fVar164 - fVar95;
                      fVar143 = fVar166 - fVar190;
                      local_1a88 = ((float)local_1aa8._0_4_ * (fVar92 + fVar189) -
                                   (fVar71 + fVar135) * (float)local_1a98._0_4_) * fVar16 +
                                   ((fVar178 + fVar174) * (float)local_1a98._0_4_ -
                                   (fVar92 + fVar189) * fVar102) * local_1ba8 +
                                   (fVar102 * (fVar71 + fVar135) -
                                   (fVar178 + fVar174) * (float)local_1aa8._0_4_) * fVar47;
                      fStack_1a84 = ((float)local_1aa8._4_4_ * (fVar93 + fVar192) -
                                    (fVar72 + fVar141) * (float)local_1a98._4_4_) * fVar17 +
                                    ((fVar139 + fVar176) * (float)local_1a98._4_4_ -
                                    (fVar93 + fVar192) * fVar106) * fStack_1ba4 +
                                    (fVar106 * (fVar72 + fVar141) -
                                    (fVar139 + fVar176) * (float)local_1aa8._4_4_) * fVar74;
                      fStack_1a80 = (fStack_1aa0 * (fVar94 + fVar195) -
                                    (fVar73 + fVar164) * fStack_1a90) * fVar18 +
                                    ((fVar142 + fVar181) * fStack_1a90 -
                                    (fVar94 + fVar195) * fVar119) * fStack_1ba0 +
                                    (fVar119 * (fVar73 + fVar164) -
                                    (fVar142 + fVar181) * fStack_1aa0) * fVar151;
                      fStack_1a7c = (fStack_1a9c * (fVar136 + fVar213) -
                                    (fVar126 + fVar166) * fStack_1a8c) * fVar19 +
                                    ((fVar184 + fVar193) * fStack_1a8c -
                                    (fVar136 + fVar213) * fVar123) * fStack_1b9c +
                                    (fVar123 * (fVar126 + fVar166) -
                                    (fVar184 + fVar193) * fStack_1a9c) * fVar20;
                      fVar103 = fVar189 - fVar96;
                      fVar107 = fVar192 - fVar105;
                      fVar120 = fVar195 - fVar109;
                      fVar124 = fVar213 - fVar122;
                      fVar200 = (fVar127 * (fVar189 + fVar96) - (fVar135 + fVar144) * fVar103) *
                                fVar16 + ((fVar174 + fVar185) * fVar103 -
                                         (fVar189 + fVar96) * fVar138) * local_1ba8 +
                                         (fVar138 * (fVar135 + fVar144) -
                                         (fVar174 + fVar185) * fVar127) * fVar47;
                      fVar201 = (fVar137 * (fVar192 + fVar105) - (fVar141 + fVar150) * fVar107) *
                                fVar17 + ((fVar176 + fVar186) * fVar107 -
                                         (fVar192 + fVar105) * fVar157) * fStack_1ba4 +
                                         (fVar157 * (fVar141 + fVar150) -
                                         (fVar176 + fVar186) * fVar137) * fVar74;
                      fVar203 = (fVar140 * (fVar195 + fVar109) - (fVar164 + fVar95) * fVar120) *
                                fVar18 + ((fVar181 + fVar188) * fVar120 -
                                         (fVar195 + fVar109) * fVar165) * fStack_1ba0 +
                                         (fVar165 * (fVar164 + fVar95) -
                                         (fVar181 + fVar188) * fVar140) * fVar151;
                      fVar204 = (fVar143 * (fVar213 + fVar122) - (fVar166 + fVar190) * fVar124) *
                                fVar19 + ((fVar193 + fVar187) * fVar124 -
                                         (fVar213 + fVar122) * fVar170) * fStack_1b9c +
                                         (fVar170 * (fVar166 + fVar190) -
                                         (fVar193 + fVar187) * fVar143) * fVar20;
                      fVar175 = fVar185 - fVar178;
                      fVar177 = fVar186 - fVar139;
                      fVar182 = fVar188 - fVar142;
                      fVar183 = fVar187 - fVar184;
                      fVar191 = fVar144 - fVar71;
                      fVar194 = fVar150 - fVar72;
                      fVar197 = fVar95 - fVar73;
                      fVar198 = fVar190 - fVar126;
                      fVar104 = fVar96 - fVar92;
                      fVar108 = fVar105 - fVar93;
                      fVar121 = fVar109 - fVar94;
                      fVar125 = fVar122 - fVar136;
                      auVar62._0_4_ =
                           (fVar191 * (fVar92 + fVar96) - (fVar71 + fVar144) * fVar104) * fVar16 +
                           ((fVar178 + fVar185) * fVar104 - (fVar92 + fVar96) * fVar175) *
                           local_1ba8 +
                           (fVar175 * (fVar71 + fVar144) - (fVar178 + fVar185) * fVar191) * fVar47;
                      auVar62._4_4_ =
                           (fVar194 * (fVar93 + fVar105) - (fVar72 + fVar150) * fVar108) * fVar17 +
                           ((fVar139 + fVar186) * fVar108 - (fVar93 + fVar105) * fVar177) *
                           fStack_1ba4 +
                           (fVar177 * (fVar72 + fVar150) - (fVar139 + fVar186) * fVar194) * fVar74;
                      auVar62._8_4_ =
                           (fVar197 * (fVar94 + fVar109) - (fVar73 + fVar95) * fVar121) * fVar18 +
                           ((fVar142 + fVar188) * fVar121 - (fVar94 + fVar109) * fVar182) *
                           fStack_1ba0 +
                           (fVar182 * (fVar73 + fVar95) - (fVar142 + fVar188) * fVar197) * fVar151;
                      auVar62._12_4_ =
                           (fVar198 * (fVar136 + fVar122) - (fVar126 + fVar190) * fVar125) * fVar19
                           + ((fVar184 + fVar187) * fVar125 - (fVar136 + fVar122) * fVar183) *
                             fStack_1b9c +
                             (fVar183 * (fVar126 + fVar190) - (fVar184 + fVar187) * fVar198) *
                             fVar20;
                      auVar99._0_4_ = local_1a88 + fVar200 + auVar62._0_4_;
                      auVar99._4_4_ = fStack_1a84 + fVar201 + auVar62._4_4_;
                      auVar99._8_4_ = fStack_1a80 + fVar203 + auVar62._8_4_;
                      auVar99._12_4_ = fStack_1a7c + fVar204 + auVar62._12_4_;
                      auVar81._4_4_ = fStack_1a84;
                      auVar81._0_4_ = local_1a88;
                      auVar81._8_4_ = fStack_1a80;
                      auVar81._12_4_ = fStack_1a7c;
                      auVar13._4_4_ = fVar201;
                      auVar13._0_4_ = fVar200;
                      auVar13._8_4_ = fVar203;
                      auVar13._12_4_ = fVar204;
                      auVar152 = minps(auVar81,auVar13);
                      auVar152 = minps(auVar152,auVar62);
                      auVar130._4_4_ = fStack_1a84;
                      auVar130._0_4_ = local_1a88;
                      auVar130._8_4_ = fStack_1a80;
                      auVar130._12_4_ = fStack_1a7c;
                      auVar14._4_4_ = fVar201;
                      auVar14._0_4_ = fVar200;
                      auVar14._8_4_ = fVar203;
                      auVar14._12_4_ = fVar204;
                      auVar75 = maxps(auVar130,auVar14);
                      auVar75 = maxps(auVar75,auVar62);
                      auVar131._4_4_ = -(uint)(auVar75._4_4_ <= ABS(auVar99._4_4_) * 1.1920929e-07);
                      auVar131._0_4_ = -(uint)(auVar75._0_4_ <= ABS(auVar99._0_4_) * 1.1920929e-07);
                      auVar131._8_4_ = -(uint)(auVar75._8_4_ <= ABS(auVar99._8_4_) * 1.1920929e-07);
                      auVar131._12_4_ =
                           -(uint)(auVar75._12_4_ <= ABS(auVar99._12_4_) * 1.1920929e-07);
                      auVar82._4_4_ =
                           -(uint)(-(ABS(auVar99._4_4_) * 1.1920929e-07) <= auVar152._4_4_);
                      auVar82._0_4_ =
                           -(uint)(-(ABS(auVar99._0_4_) * 1.1920929e-07) <= auVar152._0_4_);
                      auVar82._8_4_ =
                           -(uint)(-(ABS(auVar99._8_4_) * 1.1920929e-07) <= auVar152._8_4_);
                      auVar82._12_4_ =
                           -(uint)(-(ABS(auVar99._12_4_) * 1.1920929e-07) <= auVar152._12_4_);
                      auVar131 = auVar131 | auVar82;
                      local_1bc8 = auVar149._0_4_;
                      uStack_1bc4 = auVar149._4_4_;
                      uStack_1bc0 = auVar149._8_4_;
                      uStack_1bbc = auVar149._12_4_;
                      auVar132._0_8_ =
                           CONCAT44(auVar131._4_4_ & uStack_1bc4,auVar131._0_4_ & local_1bc8);
                      auVar132._8_4_ = auVar131._8_4_ & uStack_1bc0;
                      auVar132._12_4_ = auVar131._12_4_ & uStack_1bbc;
                      iVar28 = movmskps(iVar28,auVar132);
                      if (iVar28 == 0) {
                        auVar117._8_4_ = auVar132._8_4_;
                        auVar117._0_8_ = auVar132._0_8_;
                        auVar117._12_4_ = auVar132._12_4_;
                      }
                      else {
                        auVar173._0_4_ =
                             (float)local_1aa8._0_4_ * fVar103 - fVar127 * (float)local_1a98._0_4_;
                        auVar173._4_4_ =
                             (float)local_1aa8._4_4_ * fVar107 - fVar137 * (float)local_1a98._4_4_;
                        auVar173._8_4_ = fStack_1aa0 * fVar120 - fVar140 * fStack_1a90;
                        auVar173._12_4_ = fStack_1a9c * fVar124 - fVar143 * fStack_1a8c;
                        auVar162._0_4_ = fVar127 * fVar104 - fVar191 * fVar103;
                        auVar162._4_4_ = fVar137 * fVar108 - fVar194 * fVar107;
                        auVar162._8_4_ = fVar140 * fVar121 - fVar197 * fVar120;
                        auVar162._12_4_ = fVar143 * fVar125 - fVar198 * fVar124;
                        auVar63._4_4_ =
                             -(uint)(ABS(fVar137 * (float)local_1a98._4_4_) < ABS(fVar194 * fVar107)
                                    );
                        auVar63._0_4_ =
                             -(uint)(ABS(fVar127 * (float)local_1a98._0_4_) < ABS(fVar191 * fVar103)
                                    );
                        auVar63._8_4_ = -(uint)(ABS(fVar140 * fStack_1a90) < ABS(fVar197 * fVar120))
                        ;
                        auVar63._12_4_ =
                             -(uint)(ABS(fVar143 * fStack_1a8c) < ABS(fVar198 * fVar124));
                        auVar75 = blendvps(auVar162,auVar173,auVar63);
                        auVar169._0_4_ = fVar175 * fVar103 - fVar138 * fVar104;
                        auVar169._4_4_ = fVar177 * fVar107 - fVar157 * fVar108;
                        auVar169._8_4_ = fVar182 * fVar120 - fVar165 * fVar121;
                        auVar169._12_4_ = fVar183 * fVar124 - fVar170 * fVar125;
                        auVar64._4_4_ = -(uint)(ABS(fVar106 * fVar107) < ABS(fVar157 * fVar108));
                        auVar64._0_4_ = -(uint)(ABS(fVar102 * fVar103) < ABS(fVar138 * fVar104));
                        auVar64._8_4_ = -(uint)(ABS(fVar119 * fVar120) < ABS(fVar165 * fVar121));
                        auVar64._12_4_ = -(uint)(ABS(fVar123 * fVar124) < ABS(fVar170 * fVar125));
                        auVar8._4_4_ = (float)local_1a98._4_4_ * fVar157 - fVar106 * fVar107;
                        auVar8._0_4_ = (float)local_1a98._0_4_ * fVar138 - fVar102 * fVar103;
                        auVar8._8_4_ = fStack_1a90 * fVar165 - fVar119 * fVar120;
                        auVar8._12_4_ = fStack_1a8c * fVar170 - fVar123 * fVar124;
                        auVar172 = blendvps(auVar169,auVar8,auVar64);
                        auVar211._0_4_ = fVar138 * fVar191 - fVar175 * fVar127;
                        auVar211._4_4_ = fVar157 * fVar194 - fVar177 * fVar137;
                        auVar211._8_4_ = fVar165 * fVar197 - fVar182 * fVar140;
                        auVar211._12_4_ = fVar170 * fVar198 - fVar183 * fVar143;
                        auVar65._4_4_ =
                             -(uint)(ABS(fVar157 * (float)local_1aa8._4_4_) < ABS(fVar177 * fVar137)
                                    );
                        auVar65._0_4_ =
                             -(uint)(ABS(fVar138 * (float)local_1aa8._0_4_) < ABS(fVar175 * fVar127)
                                    );
                        auVar65._8_4_ = -(uint)(ABS(fVar165 * fStack_1aa0) < ABS(fVar182 * fVar140))
                        ;
                        auVar65._12_4_ =
                             -(uint)(ABS(fVar170 * fStack_1a9c) < ABS(fVar183 * fVar143));
                        auVar15._4_4_ = fVar106 * fVar137 - fVar157 * (float)local_1aa8._4_4_;
                        auVar15._0_4_ = fVar102 * fVar127 - fVar138 * (float)local_1aa8._0_4_;
                        auVar15._8_4_ = fVar119 * fVar140 - fVar165 * fStack_1aa0;
                        auVar15._12_4_ = fVar123 * fVar143 - fVar170 * fStack_1a9c;
                        auVar180 = blendvps(auVar211,auVar15,auVar65);
                        fVar184 = fVar16 * auVar75._0_4_ +
                                  local_1ba8 * auVar172._0_4_ + fVar47 * auVar180._0_4_;
                        fVar187 = fVar17 * auVar75._4_4_ +
                                  fStack_1ba4 * auVar172._4_4_ + fVar74 * auVar180._4_4_;
                        fVar190 = fVar18 * auVar75._8_4_ +
                                  fStack_1ba0 * auVar172._8_4_ + fVar151 * auVar180._8_4_;
                        fVar178 = fVar19 * auVar75._12_4_ +
                                  fStack_1b9c * auVar172._12_4_ + fVar20 * auVar180._12_4_;
                        auVar115._0_4_ = fVar184 + fVar184;
                        auVar115._4_4_ = fVar187 + fVar187;
                        auVar115._8_4_ = fVar190 + fVar190;
                        auVar115._12_4_ = fVar178 + fVar178;
                        auVar83._0_4_ = fVar189 * auVar180._0_4_;
                        auVar83._4_4_ = fVar192 * auVar180._4_4_;
                        auVar83._8_4_ = fVar195 * auVar180._8_4_;
                        auVar83._12_4_ = fVar213 * auVar180._12_4_;
                        fVar178 = fVar174 * auVar75._0_4_ + fVar135 * auVar172._0_4_ + auVar83._0_4_
                        ;
                        fVar213 = fVar176 * auVar75._4_4_ + fVar141 * auVar172._4_4_ + auVar83._4_4_
                        ;
                        fVar126 = fVar181 * auVar75._8_4_ + fVar164 * auVar172._8_4_ + auVar83._8_4_
                        ;
                        fVar136 = fVar193 * auVar75._12_4_ +
                                  fVar166 * auVar172._12_4_ + auVar83._12_4_;
                        auVar152 = rcpps(auVar83,auVar115);
                        fVar184 = auVar152._0_4_;
                        fVar187 = auVar152._4_4_;
                        fVar190 = auVar152._8_4_;
                        fVar193 = auVar152._12_4_;
                        fVar184 = ((1.0 - auVar115._0_4_ * fVar184) * fVar184 + fVar184) *
                                  (fVar178 + fVar178);
                        fVar187 = ((1.0 - auVar115._4_4_ * fVar187) * fVar187 + fVar187) *
                                  (fVar213 + fVar213);
                        fVar190 = ((1.0 - auVar115._8_4_ * fVar190) * fVar190 + fVar190) *
                                  (fVar126 + fVar126);
                        fVar193 = ((1.0 - auVar115._12_4_ * fVar193) * fVar193 + fVar193) *
                                  (fVar136 + fVar136);
                        auVar116._0_4_ =
                             (int)((uint)(auVar115._0_4_ != 0.0 &&
                                         (fVar184 <= *(float *)(ray + 0x80) &&
                                         *(float *)(ray + 0x30) <= fVar184)) * -0x80000000) >> 0x1f;
                        auVar116._4_4_ =
                             (int)((uint)(auVar115._4_4_ != 0.0 &&
                                         (fVar187 <= *(float *)(ray + 0x84) &&
                                         *(float *)(ray + 0x34) <= fVar187)) * -0x80000000) >> 0x1f;
                        auVar116._8_4_ =
                             (int)((uint)(auVar115._8_4_ != 0.0 &&
                                         (fVar190 <= *(float *)(ray + 0x88) &&
                                         *(float *)(ray + 0x38) <= fVar190)) * -0x80000000) >> 0x1f;
                        auVar116._12_4_ =
                             (int)((uint)(auVar115._12_4_ != 0.0 &&
                                         (fVar193 <= *(float *)(ray + 0x8c) &&
                                         *(float *)(ray + 0x3c) <= fVar193)) * -0x80000000) >> 0x1f;
                        auVar117 = auVar116 & auVar132;
                        iVar28 = movmskps(iVar28,auVar117);
                        if (iVar28 != 0) {
                          local_1798 = CONCAT44(fStack_1a84,local_1a88);
                          uStack_1790 = CONCAT44(fStack_1a7c,fStack_1a80);
                          local_17a8 = CONCAT44(fVar201,fVar200);
                          uStack_17a0 = CONCAT44(fVar204,fVar203);
                          local_17f8 = auVar180;
                          local_17e8 = auVar172;
                          local_17d8 = auVar75;
                          local_17c8 = fVar184;
                          fStack_17c4 = fVar187;
                          fStack_17c0 = fVar190;
                          fStack_17bc = fVar193;
                          local_17b8 = auVar99;
                        }
                      }
                      uVar26 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                      pRVar5 = (context->scene->geometries).items;
                      pGVar6 = pRVar5[uVar26].ptr;
                      uVar33 = pGVar6->mask;
                      auVar147._0_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x90)) == 0);
                      auVar147._4_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x94)) == 0);
                      auVar147._8_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x98)) == 0);
                      auVar147._12_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x9c)) == 0);
                      auVar148 = ~auVar147 & auVar117;
                      iVar28 = movmskps((int)pRVar5,auVar148);
                      pRVar32 = (RTCIntersectArguments *)pre.super_Precalculations.grid;
                      if (iVar28 != 0) {
                        uVar27 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                        pRVar32 = context->args;
                        if ((pRVar32->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar152 = rcpps(ZEXT416(uVar33),local_17b8);
                          fVar184 = auVar152._0_4_;
                          fVar187 = auVar152._4_4_;
                          fVar190 = auVar152._8_4_;
                          fVar193 = auVar152._12_4_;
                          fVar184 = (float)(-(uint)(1e-18 <= ABS(local_17b8._0_4_)) &
                                           (uint)(((float)DAT_01f46a60 - local_17b8._0_4_ * fVar184)
                                                  * fVar184 + fVar184));
                          fVar187 = (float)(-(uint)(1e-18 <= ABS(local_17b8._4_4_)) &
                                           (uint)((DAT_01f46a60._4_4_ - local_17b8._4_4_ * fVar187)
                                                  * fVar187 + fVar187));
                          fVar190 = (float)(-(uint)(1e-18 <= ABS(local_17b8._8_4_)) &
                                           (uint)((DAT_01f46a60._8_4_ - local_17b8._8_4_ * fVar190)
                                                  * fVar190 + fVar190));
                          fVar193 = (float)(-(uint)(1e-18 <= ABS(local_17b8._12_4_)) &
                                           (uint)((DAT_01f46a60._12_4_ - local_17b8._12_4_ * fVar193
                                                  ) * fVar193 + fVar193));
                          auVar67._0_4_ = (float)local_1798 * fVar184;
                          auVar67._4_4_ = local_1798._4_4_ * fVar187;
                          auVar67._8_4_ = (float)uStack_1790 * fVar190;
                          auVar67._12_4_ = uStack_1790._4_4_ * fVar193;
                          auVar152 = minps(auVar67,_DAT_01f46a60);
                          auVar86._0_4_ = fVar184 * (float)local_17a8;
                          auVar86._4_4_ = fVar187 * local_17a8._4_4_;
                          auVar86._8_4_ = fVar190 * (float)uStack_17a0;
                          auVar86._12_4_ = fVar193 * uStack_17a0._4_4_;
                          auVar75 = minps(auVar86,_DAT_01f46a60);
                          uVar33 = *(uint *)(local_1ac8 + lVar46);
                          uVar2 = *(uint *)(local_1ac8 + lVar46 + 4);
                          auVar118._4_4_ = uVar33;
                          auVar118._0_4_ = uVar33;
                          auVar118._8_4_ = uVar33;
                          auVar118._12_4_ = uVar33;
                          auVar180 = ZEXT816(0);
                          auVar172 = pblendw(auVar118,auVar180,0xaa);
                          fVar72 = (float)DAT_01f76ab0;
                          fVar73 = DAT_01f76ab0._4_4_;
                          fVar74 = DAT_01f76ab0._8_4_;
                          fVar92 = DAT_01f76ab0._12_4_;
                          auVar101._4_4_ = uVar2;
                          auVar101._0_4_ = uVar2;
                          auVar101._8_4_ = uVar2;
                          auVar101._12_4_ = uVar2;
                          fVar184 = auVar152._0_4_;
                          fVar187 = auVar152._4_4_;
                          fVar190 = auVar152._8_4_;
                          fVar193 = auVar152._12_4_;
                          fVar178 = auVar75._0_4_;
                          fVar139 = ((float)DAT_01f46a60 - fVar184) - fVar178;
                          fVar213 = auVar75._4_4_;
                          fVar142 = (DAT_01f46a60._4_4_ - fVar187) - fVar213;
                          fVar126 = auVar75._8_4_;
                          fVar47 = (DAT_01f46a60._8_4_ - fVar190) - fVar126;
                          fVar136 = auVar75._12_4_;
                          fVar71 = (DAT_01f46a60._12_4_ - fVar193) - fVar136;
                          auVar75 = pblendw(auVar101,auVar180,0xaa);
                          uVar3 = *(uint *)(local_1ad0 + lVar46);
                          auVar87._4_4_ = uVar3;
                          auVar87._0_4_ = uVar3;
                          auVar87._8_4_ = uVar3;
                          auVar87._12_4_ = uVar3;
                          auVar152 = pblendw(auVar87,auVar180,0xaa);
                          local_19b8 = (float)auVar152._0_4_ * fVar72 * fVar184 +
                                       (float)auVar75._0_4_ * fVar72 * fVar178 +
                                       (float)auVar172._0_4_ * fVar72 * fVar139;
                          fStack_19b4 = (float)auVar152._4_4_ * fVar73 * fVar187 +
                                        (float)auVar75._4_4_ * fVar73 * fVar213 +
                                        (float)auVar172._4_4_ * fVar73 * fVar142;
                          fStack_19b0 = (float)auVar152._8_4_ * fVar74 * fVar190 +
                                        (float)auVar75._8_4_ * fVar74 * fVar126 +
                                        (float)auVar172._8_4_ * fVar74 * fVar47;
                          fStack_19ac = (float)auVar152._12_4_ * fVar92 * fVar193 +
                                        (float)auVar75._12_4_ * fVar92 * fVar136 +
                                        (float)auVar172._12_4_ * fVar92 * fVar71;
                          local_1a08._0_8_ = local_17d8._0_8_;
                          local_1a08._8_8_ = local_17d8._8_8_;
                          local_1a08._16_8_ = local_17e8._0_8_;
                          local_1a08._24_8_ = local_17e8._8_8_;
                          local_1a08._32_8_ = local_17f8._0_8_;
                          local_1a08._40_8_ = local_17f8._8_8_;
                          local_19d8 = CONCAT44(fStack_17c4,local_17c8);
                          uStack_19d0 = CONCAT44(fStack_17bc,fStack_17c0);
                          local_19c8._4_4_ =
                               (float)(uVar3 >> 0x10) * fVar73 * fVar187 +
                               (float)(uVar2 >> 0x10) * fVar73 * fVar213 +
                               fVar142 * (float)(uVar33 >> 0x10) * fVar73;
                          local_19c8._0_4_ =
                               (float)(uVar3 >> 0x10) * fVar72 * fVar184 +
                               (float)(uVar2 >> 0x10) * fVar72 * fVar178 +
                               fVar139 * (float)(uVar33 >> 0x10) * fVar72;
                          fStack_19c0 = (float)(uVar3 >> 0x10) * fVar74 * fVar190 +
                                        (float)(uVar2 >> 0x10) * fVar74 * fVar126 +
                                        fVar47 * (float)(uVar33 >> 0x10) * fVar74;
                          fStack_19bc = (float)(uVar3 >> 0x10) * fVar92 * fVar193 +
                                        (float)(uVar2 >> 0x10) * fVar92 * fVar136 +
                                        fVar71 * (float)(uVar33 >> 0x10) * fVar92;
                          args.valid = (int *)&Ng;
                          args.geometryUserPtr = &t;
                          args.context = (RTCRayQueryContext *)&v;
                          args.ray = (RTCRayN *)&u;
                          std::
                          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                          ::
                          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                               *)&local_1a08.field_0);
                          local_1a08._0_8_ = Ng.field_0._0_8_;
                          local_1a08._8_8_ = Ng.field_0._8_8_;
                          local_1a08._16_8_ = Ng.field_0._16_8_;
                          local_1a08._24_8_ = Ng.field_0._24_8_;
                          local_1a08._32_8_ = Ng.field_0._32_8_;
                          local_1a08._40_8_ = Ng.field_0._40_8_;
                          local_19d8 = u.field_0._0_8_;
                          uStack_19d0 = u.field_0._8_8_;
                          _local_19c8 = v.field_0;
                          local_1998 = context->user->instID[0];
                          local_1988 = context->user->instPrimID[0];
                          auVar152 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar75 = blendvps(auVar152,(undefined1  [16])t.field_0,auVar148);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar75;
                          args.valid = (int *)local_1ae8;
                          args.geometryUserPtr = pGVar6->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_1a08;
                          args.N = 4;
                          pRVar32 = (RTCIntersectArguments *)pGVar6->occlusionFilterN;
                          args.ray = (RTCRayN *)ray;
                          local_1ae8 = auVar148;
                          local_19b8 = (float)uVar27;
                          fStack_19b4 = (float)uVar27;
                          fStack_19b0 = (float)uVar27;
                          fStack_19ac = (float)uVar27;
                          local_19a8 = uVar26;
                          uStack_19a4 = uVar26;
                          uStack_19a0 = uVar26;
                          uStack_199c = uVar26;
                          uStack_1994 = local_1998;
                          uStack_1990 = local_1998;
                          uStack_198c = local_1998;
                          uStack_1984 = local_1988;
                          uStack_1980 = local_1988;
                          uStack_197c = local_1988;
                          if (pRVar32 != (RTCIntersectArguments *)0x0) {
                            pRVar32 = (RTCIntersectArguments *)(*(code *)pRVar32)(&args);
                          }
                          if (local_1ae8 == (undefined1  [16])0x0) {
                            auVar90._8_4_ = 0xffffffff;
                            auVar90._0_8_ = 0xffffffffffffffff;
                            auVar90._12_4_ = 0xffffffff;
                            auVar90 = auVar90 ^ _DAT_01f46b70;
                          }
                          else {
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var7)(&args);
                            }
                            auVar69._0_4_ = -(uint)(local_1ae8._0_4_ == 0);
                            auVar69._4_4_ = -(uint)(local_1ae8._4_4_ == 0);
                            auVar69._8_4_ = -(uint)(local_1ae8._8_4_ == 0);
                            auVar69._12_4_ = -(uint)(local_1ae8._12_4_ == 0);
                            auVar90 = auVar69 ^ _DAT_01f46b70;
                            auVar75 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80)
                                               ,auVar69);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar75;
                            pRVar32 = (RTCIntersectArguments *)args.ray;
                          }
                          auVar91._0_4_ = auVar90._0_4_ << 0x1f;
                          auVar91._4_4_ = auVar90._4_4_ << 0x1f;
                          auVar91._8_4_ = auVar90._8_4_ << 0x1f;
                          auVar91._12_4_ = auVar90._12_4_ << 0x1f;
                          auVar148._0_4_ = auVar91._0_4_ >> 0x1f;
                          auVar148._4_4_ = auVar91._4_4_ >> 0x1f;
                          auVar148._8_4_ = auVar91._8_4_ >> 0x1f;
                          auVar148._12_4_ = auVar91._12_4_ >> 0x1f;
                          auVar152 = blendvps(auVar152,*(undefined1 (*) [16])(ray + 0x80),auVar91);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar152;
                        }
                        auVar149 = ~auVar148 & auVar149;
                      }
                      fVar193 = INFINITY;
                      fVar190 = INFINITY;
                      fVar187 = INFINITY;
                      fVar184 = INFINITY;
                      iVar28 = movmskps((int)pRVar32,auVar149);
                      lVar46 = lVar46 + 4;
                    } while (iVar28 != 0);
                    local_1ac8 = local_1ac8 + lVar1;
                    local_1ab0 = local_1ab0 + lVar1;
                    local_1ab8 = local_1ab8 + lVar1;
                    local_1ac0 = local_1ac0 + lVar1;
                    local_1ad0 = local_1ad0 + lVar1;
                    local_1a50 = local_1a50 + lVar1;
                    local_1a58 = local_1a58 + lVar1;
                    lVar31 = lVar31 + lVar1;
                  }
                  auVar134._0_8_ = auVar149._0_8_ ^ 0xffffffffffffffff;
                  auVar134._8_4_ = auVar149._8_4_ ^ 0xffffffff;
                  auVar134._12_4_ = auVar149._12_4_ ^ 0xffffffff;
                  puVar29 = (undefined1 *)0x0;
                }
                else {
                  pre.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                  puVar29 = *(undefined1 **)
                             (pre.super_Precalculations.grid +
                             (ulong)*(uint *)(pre.super_Precalculations.grid + 0x2c) + 0x30);
                  auVar134._8_8_ = uVar23;
                  auVar134._0_8_ = uVar22;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     (auVar134 | (undefined1  [16])terminated.field_0);
                uVar26 = movmskps((int)sVar34,(undefined1  [16])terminated.field_0);
                sVar34 = (size_t)uVar26;
                if (uVar26 == 0xf) goto LAB_006d7033;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                              (undefined1  [16])terminated.field_0);
                if (puVar29 != (undefined1 *)0x0) {
                  pNVar39->ptr = (size_t)puVar29;
                  pNVar39 = pNVar39 + 1;
                  *(undefined8 *)paVar43 = 0xff800000ff800000;
                  *(float *)((long)paVar43 + 8) = -INFINITY;
                  *(float *)((long)paVar43 + 0xc) = -INFINITY;
                  paVar43 = paVar43 + 1;
                }
              }
              goto LAB_006d5668;
            }
            sVar37 = 8;
            local_1b58 = fVar184;
            fStack_1b54 = fVar187;
            fStack_1b50 = fVar190;
            fStack_1b4c = fVar193;
            for (sVar34 = 0;
                (sVar34 != 4 &&
                (sVar4 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + sVar34 * 8), sVar4 != 8));
                sVar34 = sVar34 + 1) {
              fVar178 = *(float *)(root.ptr + 0x20 + sVar34 * 4);
              fVar213 = *(float *)(root.ptr + 0x30 + sVar34 * 4);
              fVar126 = *(float *)(root.ptr + 0x40 + sVar34 * 4);
              fVar136 = *(float *)(root.ptr + 0x50 + sVar34 * 4);
              auVar76._0_8_ =
                   CONCAT44((fVar178 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_,
                            (fVar178 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_);
              auVar76._8_4_ = (fVar178 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
              auVar76._12_4_ = (fVar178 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_
              ;
              auVar53._0_8_ =
                   CONCAT44((fVar126 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_,
                            (fVar126 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_);
              auVar53._8_4_ = (fVar126 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_;
              auVar53._12_4_ = (fVar126 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_
              ;
              fVar178 = *(float *)(root.ptr + 0x60 + sVar34 * 4);
              auVar128._0_8_ =
                   CONCAT44((fVar178 - (float)tray.org.field_0._36_4_) *
                            (float)tray.rdir.field_0._36_4_,
                            (fVar178 - (float)tray.org.field_0._32_4_) *
                            (float)tray.rdir.field_0._32_4_);
              auVar128._8_4_ =
                   (fVar178 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              auVar128._12_4_ =
                   (fVar178 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              auVar97._0_4_ = (fVar213 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_;
              auVar97._4_4_ = (fVar213 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_;
              auVar97._8_4_ = (fVar213 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
              auVar97._12_4_ = (fVar213 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_
              ;
              auVar111._0_4_ = (fVar136 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_
              ;
              auVar111._4_4_ = (fVar136 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_
              ;
              auVar111._8_4_ = (fVar136 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_
              ;
              auVar111._12_4_ =
                   (fVar136 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_;
              fVar178 = *(float *)(root.ptr + 0x70 + sVar34 * 4);
              auVar153._0_4_ =
                   (fVar178 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              auVar153._4_4_ =
                   (fVar178 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              auVar153._8_4_ =
                   (fVar178 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              auVar153._12_4_ =
                   (fVar178 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              auVar145._8_4_ = auVar76._8_4_;
              auVar145._0_8_ = auVar76._0_8_;
              auVar145._12_4_ = auVar76._12_4_;
              auVar152 = minps(auVar145,auVar97);
              auVar158._8_4_ = auVar53._8_4_;
              auVar158._0_8_ = auVar53._0_8_;
              auVar158._12_4_ = auVar53._12_4_;
              auVar75 = minps(auVar158,auVar111);
              auVar152 = maxps(auVar152,auVar75);
              auVar159._8_4_ = auVar128._8_4_;
              auVar159._0_8_ = auVar128._0_8_;
              auVar159._12_4_ = auVar128._12_4_;
              auVar75 = minps(auVar159,auVar153);
              auVar152 = maxps(auVar152,auVar75);
              auVar146._0_8_ = CONCAT44(auVar152._4_4_ * 0.99999964,auVar152._0_4_ * 0.99999964);
              auVar146._8_4_ = auVar152._8_4_ * 0.99999964;
              auVar146._12_4_ = auVar152._12_4_ * 0.99999964;
              auVar75 = maxps(auVar76,auVar97);
              auVar152 = maxps(auVar53,auVar111);
              auVar152 = minps(auVar75,auVar152);
              auVar75 = maxps(auVar128,auVar153);
              auVar152 = minps(auVar152,auVar75);
              auVar77._0_4_ = auVar152._0_4_ * 1.0000004;
              auVar77._4_4_ = auVar152._4_4_ * 1.0000004;
              auVar77._8_4_ = auVar152._8_4_ * 1.0000004;
              auVar77._12_4_ = auVar152._12_4_ * 1.0000004;
              auVar54._8_4_ = auVar146._8_4_;
              auVar54._0_8_ = auVar146._0_8_;
              auVar54._12_4_ = auVar146._12_4_;
              auVar152 = maxps(auVar54,(undefined1  [16])tray.tnear.field_0);
              auVar75 = minps(auVar77,(undefined1  [16])tray.tfar.field_0);
              auVar55._4_4_ = -(uint)(auVar152._4_4_ <= auVar75._4_4_);
              auVar55._0_4_ = -(uint)(auVar152._0_4_ <= auVar75._0_4_);
              auVar55._8_4_ = -(uint)(auVar152._8_4_ <= auVar75._8_4_);
              auVar55._12_4_ = -(uint)(auVar152._12_4_ <= auVar75._12_4_);
              uVar26 = movmskps((int)valid_i,auVar55);
              valid_i = (vint<4> *)(ulong)uVar26;
              if (uVar26 == 0) {
                auVar79._4_4_ = fStack_1b54;
                auVar79._0_4_ = local_1b58;
                auVar79._8_4_ = fStack_1b50;
                auVar79._12_4_ = fStack_1b4c;
                sVar4 = sVar37;
              }
              else {
                auVar78._4_4_ = fVar187;
                auVar78._0_4_ = fVar184;
                auVar78._8_4_ = fVar190;
                auVar78._12_4_ = fVar193;
                auVar79 = blendvps(auVar78,auVar146,auVar55);
                if (sVar37 != 8) {
                  pNVar39->ptr = sVar37;
                  pNVar39 = pNVar39 + 1;
                  paVar43->v[0] = local_1b58;
                  paVar43->v[1] = fStack_1b54;
                  paVar43->v[2] = fStack_1b50;
                  paVar43->v[3] = fStack_1b4c;
                  paVar43 = paVar43 + 1;
                }
              }
              sVar37 = sVar4;
              local_1b58 = auVar79._0_4_;
              fStack_1b54 = auVar79._4_4_;
              fStack_1b50 = auVar79._8_4_;
              fStack_1b4c = auVar79._12_4_;
            }
            if (sVar37 == 8) goto LAB_006d583e;
            auVar56._4_4_ = -(uint)(fStack_1b54 < tray.tfar.field_0.v[1]);
            auVar56._0_4_ = -(uint)(local_1b58 < tray.tfar.field_0.v[0]);
            auVar56._8_4_ = -(uint)(fStack_1b50 < tray.tfar.field_0.v[2]);
            auVar56._12_4_ = -(uint)(fStack_1b4c < tray.tfar.field_0.v[3]);
            uVar27 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar56);
            puVar30 = (undefined1 *)(ulong)(uint)POPCOUNT(uVar27);
            root.ptr = sVar37;
          } while ((byte)uVar40 < (byte)POPCOUNT(uVar27));
          pNVar39->ptr = sVar37;
          pNVar39 = pNVar39 + 1;
          paVar43->v[0] = local_1b58;
          paVar43->v[1] = fStack_1b54;
          paVar43->v[2] = fStack_1b50;
          paVar43->v[3] = fStack_1b4c;
          paVar43 = paVar43 + 1;
        }
        else {
          while (uVar42 != 0) {
            sVar37 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> sVar37 & 1) == 0; sVar37 = sVar37 + 1) {
              }
            }
            uVar42 = uVar42 & uVar42 - 1;
            sVar34 = sVar37;
            valid_i = (vint<4> *)This;
            bVar25 = occluded1(This,bvh,root,sVar37,&pre,ray,&tray,context);
            if (bVar25) {
              terminated.field_0.i[sVar37] = -1;
            }
          }
          uVar33 = movmskps((int)sVar34,(undefined1  [16])terminated.field_0);
          sVar34 = (size_t)uVar33;
          puVar29 = (undefined1 *)0x3;
          fVar184 = INFINITY;
          fVar187 = INFINITY;
          fVar190 = INFINITY;
          fVar193 = INFINITY;
          local_1b58 = vVar21.field_0._0_4_;
          fStack_1b54 = vVar21.field_0._4_4_;
          fStack_1b50 = vVar21.field_0._8_4_;
          fStack_1b4c = vVar21.field_0._12_4_;
          if (uVar33 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            puVar29 = (undefined1 *)0x2;
          }
          puVar30 = puVar29;
          if (uVar40 < (uint)POPCOUNT(uVar26 & 0xff)) goto LAB_006d56a9;
        }
LAB_006d583e:
      } while (((int)puVar29 == 4) || ((int)puVar29 == 2));
LAB_006d7033:
      auVar70._4_4_ = uVar199 & terminated.field_0.i[1];
      auVar70._0_4_ = uVar196 & terminated.field_0.i[0];
      auVar70._8_4_ = uVar202 & terminated.field_0.i[2];
      auVar70._12_4_ = uVar205 & terminated.field_0.i[3];
      auVar152 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar70);
      *(undefined1 (*) [16])(ray + 0x80) = auVar152;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }